

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDCircles.cpp
# Opt level: O2

double ** EDCircles::AllocateMatrix(int noRows,int noColumns)

{
  double **ppdVar1;
  double *__s;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar4 = 0;
  uVar3 = (ulong)(uint)noRows << 3;
  if (noRows < 0) {
    uVar3 = 0xffffffffffffffff;
  }
  uVar2 = (ulong)(uint)noRows;
  if (noRows < 1) {
    uVar2 = uVar4;
  }
  ppdVar1 = (double **)operator_new__(uVar3);
  uVar3 = 0xffffffffffffffff;
  if (-1 < noColumns) {
    uVar3 = (long)noColumns * 8;
  }
  for (; uVar2 != uVar4; uVar4 = uVar4 + 1) {
    __s = (double *)operator_new__(uVar3);
    ppdVar1[uVar4] = __s;
    memset(__s,0,(long)noColumns * 8);
  }
  return ppdVar1;
}

Assistant:

double ** EDCircles::AllocateMatrix(int noRows, int noColumns)
{
	double **m = new double *[noRows];
	
	for (int i = 0; i<noRows; i++) {
		m[i] = new double[noColumns];
		memset(m[i], 0, sizeof(double)*noColumns);
	} // end-for

	return m;
}